

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.c
# Opt level: O3

void fft_equalize(fft_window_data *data,void *user)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  int iVar4;
  uint32_t i;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  
  uVar2 = (uint)data->framesize;
  if (uVar2 != 0) {
    pfVar3 = data->fft_workspace;
    uVar11 = 0;
    do {
      fVar12 = pfVar3[uVar11];
      uVar10 = (int)uVar11 + 1;
      fVar14 = pfVar3[uVar10];
      auVar15 = ZEXT416((uint)(fVar12 * fVar12 + fVar14 * fVar14));
      auVar15 = vsqrtss_avx(auVar15,auVar15);
      pfVar3[uVar11] = auVar15._0_4_ + auVar15._0_4_;
      fVar12 = atan2f(fVar14,fVar12);
      pfVar3[uVar10] = fVar12;
      uVar10 = (int)uVar11 + 2;
      uVar11 = (ulong)uVar10;
    } while (uVar10 < uVar2);
    uVar10 = uVar2 >> 4;
    uVar5 = 0;
    do {
      uVar6 = (ulong)uVar5;
      auVar15._0_8_ = (double)((float)uVar6 / (float)uVar2);
      auVar15._8_8_ = 0;
      auVar15 = vsqrtsd_avx(auVar15,auVar15);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auVar15._0_8_ * (double)(uVar2 >> 1);
      auVar15 = vroundsd_avx(auVar17,auVar17,9);
      uVar11 = (ulong)(uint)(int)auVar15._0_8_ / (ulong)uVar10;
      iVar4 = (int)uVar11;
      uVar7 = 1;
      if (1 < iVar4) {
        uVar7 = uVar11;
      }
      uVar8 = 2;
      if (2 < iVar4) {
        uVar8 = uVar11;
      }
      iVar9 = 6;
      if (iVar4 < 6) {
        iVar9 = iVar4;
      }
      fVar16 = (float)((uint)(int)auVar15._0_8_ % uVar10) / (float)uVar10;
      fVar12 = *(float *)((long)user + uVar8 * 4 + 0x60);
      fVar14 = *(float *)((long)user + uVar7 * 4 + 100);
      fVar13 = *(float *)((long)user + (long)iVar4 * 4 + 0x68);
      fVar1 = *(float *)((long)user + (long)iVar9 * 4 + 0x6c);
      pfVar3[uVar6] =
           (fVar16 * fVar16 * (fVar13 * -3.0 + (fVar14 * 3.0 - fVar12) + fVar1) * fVar16 +
           fVar16 * ((fVar13 * 4.0 + fVar12 + fVar12 + fVar14 * -5.0) - fVar1) * fVar16 +
           fVar14 + fVar14 + fVar16 * (fVar13 - fVar12)) * 0.5 * pfVar3[uVar6];
      uVar5 = uVar5 + 2;
    } while (uVar5 < uVar2);
    uVar10 = 0;
    do {
      fVar12 = pfVar3[uVar10];
      fVar14 = pfVar3[uVar10 + 1];
      fVar13 = cosf(fVar14);
      pfVar3[uVar10] = fVar13 * fVar12;
      fVar14 = sinf(fVar14);
      pfVar3[uVar10 + 1] = fVar14 * fVar12;
      uVar10 = uVar10 + 2;
    } while (uVar10 < uVar2);
  }
  return;
}

Assistant:

VECTORIZE void fft_equalize(struct fft_window_data *data, void *user){
  struct equalizer_segment_data *user_data = (struct equalizer_segment_data *)user;
  uint32_t framesize = data->framesize;
  float *fft_workspace = data->fft_workspace;
  float *bands = user_data->bands;

  // Change to mag/phase
  for(uint32_t i = 0; i < framesize; i+= 2){
    float re = fft_workspace[i+0];
    float im = fft_workspace[i+1];
    fft_workspace[i+0] = sqrtf(re * re + im * im) * 2;
    fft_workspace[i+1] = atan2f(im, re);
  }

  // Perform band eq
  for(uint32_t p = 0; p < framesize; p+= 2){
    int i = (int)floor(sqrt(p / (float)(framesize)) * (framesize / 2));
	int p2 = (i / (framesize / 16));
	int p1 = p2 - 1;
	int p0 = p1 - 1;
	int p3 = p2 + 1;
	if (p1 < 0) p1 = 0;
	if (p0 < 0) p0 = 0;
	if (p3 > 7) p3 = 7;
	float v = (float)(i % (framesize / 16)) / (float)(framesize / 16);
	fft_workspace[p] *= catmullrom(v, bands[p0], bands[p1], bands[p2], bands[p3]);
  }

  // Change back to complex
  for(uint32_t i = 0; i < framesize; i+= 2){
	float mag = fft_workspace[i+0];
	float pha = fft_workspace[i+1];
	fft_workspace[i+0] = cosf(pha) * mag;
	fft_workspace[i+1] = sinf(pha) * mag;
  }
}